

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh_key_clone.c
# Opt level: O0

ssh_key * ssh_key_clone(ssh_key *key)

{
  _Bool _Var1;
  strbuf *sb;
  strbuf *sb_00;
  ssh_keyalg *psVar2;
  ptrlen priv_00;
  ptrlen pVar3;
  strbuf *priv;
  ssh_key *copy;
  strbuf *pub;
  ssh_key *key_local;
  
  sb = strbuf_new_nm();
  ssh_key_public_blob(key,sb->binarysink_);
  _Var1 = ssh_key_has_private(key);
  if (_Var1) {
    sb_00 = strbuf_new_nm();
    ssh_key_private_blob(key,sb_00->binarysink_);
    psVar2 = ssh_key_alg(key);
    pVar3 = ptrlen_from_strbuf(sb);
    priv_00 = ptrlen_from_strbuf(sb_00);
    priv = (strbuf *)ssh_key_new_priv(psVar2,pVar3,priv_00);
    strbuf_free(sb_00);
  }
  else {
    psVar2 = ssh_key_alg(key);
    pVar3 = ptrlen_from_strbuf(sb);
    priv = (strbuf *)ssh_key_new_pub(psVar2,pVar3);
  }
  strbuf_free(sb);
  return (ssh_key *)priv;
}

Assistant:

ssh_key *ssh_key_clone(ssh_key *key)
{
    /*
     * To avoid having to add a special method in the vtable API, we
     * clone by round-tripping through public and private blobs.
     */
    strbuf *pub = strbuf_new_nm();
    ssh_key_public_blob(key, BinarySink_UPCAST(pub));

    ssh_key *copy;

    if (ssh_key_has_private(key)) {
        strbuf *priv = strbuf_new_nm();
        ssh_key_private_blob(key, BinarySink_UPCAST(priv));
        copy = ssh_key_new_priv(ssh_key_alg(key), ptrlen_from_strbuf(pub),
                                ptrlen_from_strbuf(priv));
        strbuf_free(priv);
    } else {
        copy = ssh_key_new_pub(ssh_key_alg(key), ptrlen_from_strbuf(pub));
    }

    strbuf_free(pub);
    return copy;
}